

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::flyd_wait_request_handler_proc_p1(CSocekt *this,lp_connection_t c)

{
  long lVar1;
  uint16_t uVar2;
  long *plVar3;
  long in_RSI;
  CMemory *in_RDI;
  LPSTRUC_MSG_HEADER ptmpMsgHeader;
  char *pTmpBuffer;
  unsigned_short e_pkgLen;
  LPCOMM_PKG_HEADER pPkgHeader;
  CMemory *p_memory;
  lp_connection_t in_stack_00000058;
  CSocekt *in_stack_00000060;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  
  CMemory::GetInstance();
  uVar2 = ntohs(*(uint16_t *)(in_RSI + 0x6d));
  if ((ulong)uVar2 < *(ulong *)(in_RDI + 8)) {
    *(undefined1 *)(in_RSI + 0x6c) = 0;
    *(long *)(in_RSI + 0x88) = in_RSI + 0x6d;
    *(int *)(in_RSI + 0x90) = (int)*(undefined8 *)(in_RDI + 8);
  }
  else if (uVar2 < 0x7149) {
    plVar3 = (long *)CMemory::AllocMemory
                               (in_RDI,in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
    *(undefined1 *)(in_RSI + 0xa0) = 1;
    *(long **)(in_RSI + 0xa8) = plVar3;
    *plVar3 = in_RSI;
    plVar3[1] = *(long *)(in_RSI + 0x20);
    lVar1 = *(long *)(in_RDI + 0x10);
    memcpy((void *)(lVar1 + (long)plVar3),(uint16_t *)(in_RSI + 0x6d),*(size_t *)(in_RDI + 8));
    if ((ulong)uVar2 == *(ulong *)(in_RDI + 8)) {
      flyd_wait_request_handler_proc_plast(in_stack_00000060,in_stack_00000058);
    }
    else {
      *(undefined1 *)(in_RSI + 0x6c) = 2;
      *(long *)(in_RSI + 0x88) = lVar1 + (long)plVar3 + *(long *)(in_RDI + 8);
      *(uint *)(in_RSI + 0x90) = (uint)uVar2 - (int)*(undefined8 *)(in_RDI + 8);
    }
  }
  else {
    *(undefined1 *)(in_RSI + 0x6c) = 0;
    *(long *)(in_RSI + 0x88) = in_RSI + 0x6d;
    *(int *)(in_RSI + 0x90) = (int)*(undefined8 *)(in_RDI + 8);
  }
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler_proc_p1(lp_connection_t c)
{
    CMemory *p_memory = CMemory::GetInstance();

    LPCOMM_PKG_HEADER pPkgHeader;
    pPkgHeader = (LPCOMM_PKG_HEADER)c->dataHeadInfo; //正好收到包头时，包头信息肯定是在dataHeadInfo里；

    unsigned short e_pkgLen;
    e_pkgLen = ntohs(pPkgHeader->pkgLen);  //注意这里网络序转本机序，所有传输到网络上的2字节数据，都要用htons()转成网络序，所有从网络上收到的2字节数据，都要用ntohs()转成本机序
    //ntohs/htons的目的就是保证不同操作系统数据之间收发的正确性，【不管客户端/服务器是什么操作系统，发送的数字是多少，收到的就是多少】
    //不明白的同学，直接百度搜索"网络字节序" "主机字节序" "c++ 大端" "c++ 小端"
    //恶意包或者错误包的判断
    if(e_pkgLen < m_iLenPkgHeader)
    {
        //伪造包/或者包错误，否则整个包长怎么可能比包头还小？（整个包长是包头+包体，就算包体为0字节，那么至少e_pkgLen == m_iLenPkgHeader）
        //报文总长度 < 包头长度，认定非法用户，废包
        //状态和接收位置都复原，这些值都有必要，因为有可能在其他状态比如_PKG_HD_RECVING状态调用这个函数；
        c->curStat = _PKG_HD_INIT;
        c->precvbuf = c->dataHeadInfo;
        c->irecvlen = m_iLenPkgHeader;
    }
    else if(e_pkgLen > (_PKG_MAX_LENGTH-1000))   //客户端发来包居然说包长度 > 29000?肯定是恶意包
    {
        //恶意包，太大，认定非法用户，废包【包头中说这个包总长度这么大，这不行】
        //状态和接收位置都复原，这些值都有必要，因为有可能在其他状态比如_PKG_HD_RECVING状态调用这个函数；
        c->curStat = _PKG_HD_INIT;
        c->precvbuf = c->dataHeadInfo;
        c->irecvlen = m_iLenPkgHeader;
    }
    else
    {
        //合法的包头，继续处理
        //我现在要分配内存开始收包体，因为包体长度并不是固定的，所以内存肯定要new出来；
        char *pTmpBuffer  = (char *)p_memory->AllocMemory(m_iLenMsgHeader + e_pkgLen,false); //分配内存【长度是 消息头长度  + 包头长度 + 包体长度】，最后参数先给false，表示内存不需要memset;
        c->ifnewrecvMem   = true;        //标记我们new了内存，将来在flyd_free_connection()要回收的
        c->pnewMemPointer = pTmpBuffer;  //内存开始指针

        //a)先填写消息头内容
        LPSTRUC_MSG_HEADER ptmpMsgHeader = (LPSTRUC_MSG_HEADER)pTmpBuffer;
        ptmpMsgHeader->pConn = c;
        ptmpMsgHeader->iCurrsequence = c->iCurrsequence; //收到包时的连接池中连接序号记录到消息头里来，以备将来用；
        //b)再填写包头内容
        pTmpBuffer += m_iLenMsgHeader;                 //往后跳，跳过消息头，指向包头
        memcpy(pTmpBuffer,pPkgHeader,m_iLenPkgHeader); //直接把收到的包头拷贝进来
        if(e_pkgLen == m_iLenPkgHeader)
        {
            //该报文只有包头无包体【我们允许一个包只有包头，没有包体】
            //这相当于收完整了，则直接入消息队列待后续业务逻辑线程去处理吧
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //开始收包体，注意我的写法
            c->curStat = _PKG_BD_INIT;                   //当前状态发生改变，包头刚好收完，准备接收包体
            c->precvbuf = pTmpBuffer + m_iLenPkgHeader;  //pTmpBuffer指向包头，这里 + m_iLenPkgHeader后指向包体 weizhi
            c->irecvlen = e_pkgLen - m_iLenPkgHeader;    //e_pkgLen是整个包【包头+包体】大小，-m_iLenPkgHeader【包头】  = 包体
        }
    }  //end if(e_pkgLen < m_iLenPkgHeader)

}